

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

void __thiscall settings_tests::ReadWrite::test_method(ReadWrite *this)

{
  _Rb_tree_header *left_end;
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  allocator_type *__a;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_09;
  const_string file_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar8;
  char *pcVar7;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  allocator_type local_5b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fail_parse;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  non_kv;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dup_keys;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  string local_310;
  undefined1 local_2f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  pointer local_2c8;
  pointer pbStack_2c0;
  pointer local_2b8;
  pointer pUStack_2b0;
  pointer local_2a8;
  pointer pUStack_2a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  values;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_130;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  expected;
  path local_88;
  path path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::path::operator/=((path *)&local_88,"settings.json");
  std::filesystem::__cxx11::path::path(&path.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,
             "{\n        \"string\": \"string\",\n        \"num\": 5,\n        \"bool\": true,\n        \"null\": null\n    }"
             ,(allocator<char> *)local_2f0);
  WriteText(&path,(string *)&values);
  std::__cxx11::string::~string((string *)&values);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)&values,(char (*) [7])0xe104af,(char (*) [7])0xe104af);
  local_310._M_dataplus._M_p._0_4_ = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[4],_int,_true>(&local_220,(char (*) [4])0xcb3348,(int *)&local_310);
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(errors.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[5],_bool,_true>(&local_1a8,(char (*) [5])0xba8a07,(bool *)&errors);
  local_2f0._8_8_ = &local_2d8;
  local_2f0._16_8_ = 0;
  local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
  local_2f0._0_8_ = (ulong)(uint)local_2f0._4_4_ << 0x20;
  local_2c8 = (pointer)0x0;
  pbStack_2c0 = (pointer)0x0;
  local_2b8 = (pointer)0x0;
  pUStack_2b0 = (pointer)0x0;
  local_2a8 = (pointer)0x0;
  pUStack_2a0 = (pointer)0x0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::pair<const_char_(&)[5],_true>(&local_130,(char (*) [5])0xbd1acc,(UniValue *)local_2f0);
  __a = (allocator_type *)&non_kv;
  __l._M_len = 4;
  __l._M_array = (iterator)&values;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::map(&expected,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &dup_keys,__a);
  lVar4 = 0x168;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)(&values._M_t._M_impl.field_0x0 + lVar4));
    lVar4 = lVar4 + -0x78;
  } while (lVar4 != -0x78);
  UniValue::~UniValue((UniValue *)local_2f0);
  left_end = &values._M_t._M_impl.super__Rb_tree_header;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_338;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &left_end->_M_header;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &left_end->_M_header;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_348,msg);
  bVar2 = common::ReadSettings(&path,&values,&errors);
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xc1c43e;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c468;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_350 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity =
       (size_type)
       (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       &dup_keys;
  local_310._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,_cVar8,
             (size_t)&local_358,0x4b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4c;
  file_00.m_begin = (iterator)&local_368;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_378,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&local_310,(equal_coll_impl *)&dup_keys,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )values._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )left_end,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )expected._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
              )&expected._M_t._M_impl.super__Rb_tree_header);
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_380 = "";
  pcVar7 = "values.begin()";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0xd,4,0xc1c3ca,
             (size_t)&local_388,0x4c,"values.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_398;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3a8,
             msg_01);
  local_310._M_dataplus._M_p._0_1_ =
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b33d;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c3f4;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3b0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&dup_keys;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_3b8,0x4d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::filesystem::remove((path *)&path);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x51;
  file_02.m_begin = (iterator)&local_3c8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3d8,
             msg_02);
  local_310._M_dataplus._M_p._0_1_ = common::ReadSettings(&path,&values,&errors);
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xc1c43e;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c468;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3e0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&dup_keys;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_3e8,0x51);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x52;
  file_03.m_begin = (iterator)&local_3f8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_408,
             msg_03);
  local_310._M_dataplus._M_p._0_1_ = values._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b348;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c403;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_410 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&dup_keys;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_418,0x52);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x53;
  file_04.m_begin = (iterator)&local_428;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_438,
             msg_04);
  local_310._M_dataplus._M_p._0_1_ =
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       errors.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b33d;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c3f4;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_440 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&dup_keys;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_448,0x53);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,
             "{\n        \"dupe\": \"string\",\n        \"dupe\": \"dupe\"\n    }",
             (allocator<char> *)&local_310);
  WriteText(&path,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5a;
  file_05.m_begin = (iterator)&local_458;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_468,
             msg_05);
  bVar2 = common::ReadSettings(&path,&values,&errors);
  local_310._M_dataplus._M_p._0_1_ = !bVar2;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b36c;
  dup_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c468;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_470 = "";
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a;
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&dup_keys;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_478,0x5a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::string(&local_310,&path.super_path);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_2f0,(tinyformat *)"Found duplicate key dupe in settings file %s",
             (char *)&local_310,pbVar3);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&dup_keys,__l_00,(allocator_type *)&non_kv);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5c;
  file_06.m_begin = (iterator)&local_4a0;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4b0,
             msg_06);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&local_310,(equal_coll_impl *)&non_kv,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dup_keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dup_keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4b8 = "";
  pcVar7 = "errors.begin()";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0xd,4,0xc1c496,
             (size_t)&local_4c0,0x5c,"errors.end()","dup_keys.begin()","dup_keys.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x5d;
  file_07.m_begin = (iterator)&local_4d0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4e0,
             msg_07);
  local_310._M_dataplus._M_p._0_1_ = values._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b348;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c403;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4e8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&non_kv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_4f0,0x5d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,"\"non-kv\"",(allocator<char> *)&local_310);
  WriteText(&path,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x61;
  file_08.m_begin = (iterator)&local_500;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_510,
             msg_08);
  bVar2 = common::ReadSettings(&path,&values,&errors);
  local_310._M_dataplus._M_p._0_1_ = !bVar2;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b36c;
  non_kv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c468;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_518 = "";
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61;
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&non_kv;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_520,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::string(&local_310,&path.super_path);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_2f0,
             (tinyformat *)"Found non-object value \"non-kv\" in settings file %s",
             (char *)&local_310,pbVar3);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&non_kv,__l_01,(allocator_type *)&fail_parse);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x63;
  file_09.m_begin = (iterator)&local_548;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_558,
             msg_09);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&local_310,(equal_coll_impl *)&fail_parse,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )non_kv.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )non_kv.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_560 = "";
  pcVar7 = "errors.begin()";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0xd,4,0xc1c496,
             (size_t)&local_568,99,"errors.end()","non_kv.begin()","non_kv.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,"invalid json",(allocator<char> *)&local_310);
  WriteText(&path,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x67;
  file_10.m_begin = (iterator)&local_578;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_588,
             msg_10);
  bVar2 = common::ReadSettings(&path,&values,&errors);
  local_310._M_dataplus._M_p._0_4_ = CONCAT31(local_310._M_dataplus._M_p._1_3_,!bVar2);
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  fail_parse.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_101b36c;
  fail_parse.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc1c468;
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_590 = "";
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x67;
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_2d8._M_allocated_capacity = (size_type)(equal_coll_impl *)&fail_parse;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_598,0x67);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::string(&local_310,&path.super_path);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_2f0,
             (tinyformat *)
             "Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, and can be fixed by removing the file, which will reset settings to default values."
             ,(char *)&local_310,pbVar3);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&fail_parse,__l_02,&local_5b1);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x6b;
  file_11.m_begin = (iterator)&local_5c8;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5d8,
             msg_11);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&local_310,(equal_coll_impl *)&local_5b1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )fail_parse.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )fail_parse.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_5e0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,(lazy_ostream *)local_2f0,1,0xd,4,0xc1c496,
             (size_t)&local_5e8,0x6b,"errors.end()","fail_parse.begin()","fail_parse.end()");
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fail_parse);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&non_kv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dup_keys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&errors);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~_Rb_tree(&values._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~_Rb_tree(&expected._M_t);
  std::filesystem::__cxx11::path::~path(&path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ReadWrite)
{
    fs::path path = m_args.GetDataDirBase() / "settings.json";

    WriteText(path, R"({
        "string": "string",
        "num": 5,
        "bool": true,
        "null": null
    })");

    std::map<std::string, common::SettingsValue> expected{
        {"string", "string"},
        {"num", 5},
        {"bool", true},
        {"null", {}},
    };

    // Check file read.
    std::map<std::string, common::SettingsValue> values;
    std::vector<std::string> errors;
    BOOST_CHECK(common::ReadSettings(path, values, errors));
    BOOST_CHECK_EQUAL_COLLECTIONS(values.begin(), values.end(), expected.begin(), expected.end());
    BOOST_CHECK(errors.empty());

    // Check no errors if file doesn't exist.
    fs::remove(path);
    BOOST_CHECK(common::ReadSettings(path, values, errors));
    BOOST_CHECK(values.empty());
    BOOST_CHECK(errors.empty());

    // Check duplicate keys not allowed and that values returns empty if a duplicate is found.
    WriteText(path, R"({
        "dupe": "string",
        "dupe": "dupe"
    })");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> dup_keys = {strprintf("Found duplicate key dupe in settings file %s", fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), dup_keys.begin(), dup_keys.end());
    BOOST_CHECK(values.empty());

    // Check non-kv json files not allowed
    WriteText(path, R"("non-kv")");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> non_kv = {strprintf("Found non-object value \"non-kv\" in settings file %s", fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), non_kv.begin(), non_kv.end());

    // Check invalid json not allowed
    WriteText(path, R"(invalid json)");
    BOOST_CHECK(!common::ReadSettings(path, values, errors));
    std::vector<std::string> fail_parse = {strprintf("Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, "
                                                     "and can be fixed by removing the file, which will reset settings to default values.",
                                                     fs::PathToString(path))};
    BOOST_CHECK_EQUAL_COLLECTIONS(errors.begin(), errors.end(), fail_parse.begin(), fail_parse.end());
}